

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_state_callback_clear(callback_type_e c_type)

{
  int iVar1;
  fio_ls_embd_s *__ptr;
  callback_data_s *tmp;
  callback_type_e c_type_local;
  
  if ((-1 < (int)c_type) && (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK))) {
    fio_lock(&callback_collection[c_type].lock);
    fio_state_callback_ensure(callback_collection + c_type);
    while (iVar1 = fio_ls_embd_any(&callback_collection[c_type].callbacks), iVar1 != 0) {
      __ptr = fio_ls_embd_shift(&callback_collection[c_type].callbacks);
      free(__ptr);
    }
    fio_unlock(&callback_collection[c_type].lock);
  }
  return;
}

Assistant:

void fio_state_callback_clear(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  while (fio_ls_embd_any(&callback_collection[c_type].callbacks)) {
    callback_data_s *tmp = FIO_LS_EMBD_OBJ(
        callback_data_s, node,
        fio_ls_embd_shift(&callback_collection[c_type].callbacks));
    free(tmp);
  }
  fio_unlock(&callback_collection[c_type].lock);
}